

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

int Gia_ObjIsPo(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = 0;
  if ((~*(uint *)pObj & 0x1fffffff) != 0 && (int)*(uint *)pObj < 0) {
    iVar2 = Gia_ObjCioId(pObj);
    uVar1 = (uint)(iVar2 < p->vCos->nSize - p->nRegs);
  }
  return uVar1;
}

Assistant:

static inline int          Gia_ObjIsPo( Gia_Man_t * p, Gia_Obj_t * pObj )      { return Gia_ObjIsCo(pObj) && Gia_ObjCioId(pObj) < Gia_ManPoNum(p);   }